

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O2

void Kit_TruthIsopPrintCover(Vec_Int_t *vCover,int nVars,int fCompl)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int __c;
  byte bVar5;
  bool bVar6;
  
  uVar1 = vCover->nSize;
  if (uVar1 == 0) {
LAB_004cfb78:
    printf("Constant %d\n",(ulong)uVar1);
    return;
  }
  if (uVar1 == 1) {
    iVar2 = Vec_IntEntry(vCover,0);
    if (iVar2 == 0) {
      uVar1 = vCover->nSize;
      goto LAB_004cfb78;
    }
  }
  if (nVars < 1) {
    nVars = 0;
  }
  for (iVar2 = 0; iVar2 < vCover->nSize; iVar2 = iVar2 + 1) {
    iVar3 = Vec_IntEntry(vCover,iVar2);
    bVar5 = 0;
    iVar4 = nVars;
    while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
      __c = 0x30;
      switch(iVar3 >> (bVar5 & 0x1f) & 3) {
      case 0:
        __c = 0x2d;
        break;
      case 2:
        __c = 0x31;
        break;
      case 3:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                      ,0xca,"void Kit_TruthIsopPrintCover(Vec_Int_t *, int, int)");
      }
      putchar(__c);
      bVar5 = bVar5 + 2;
    }
    printf(" %d\n",(ulong)(fCompl == 0));
  }
  return;
}

Assistant:

void Kit_TruthIsopPrintCover( Vec_Int_t * vCover, int nVars, int fCompl )
{
    int i, k, Entry, Literal;
    if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover, 0) == 0) )
    {
        printf( "Constant %d\n", Vec_IntSize(vCover) );
        return;
    }
    Vec_IntForEachEntry( vCover, Entry, i )
    { 
        for ( k = 0; k < nVars; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 ) // neg literal
                printf( "0" );
            else if ( Literal == 2 ) // pos literal
                printf( "1" );
            else if ( Literal == 0 ) 
                printf( "-" );
            else assert( 0 );
        }
        printf( " %d\n", !fCompl );
    }
}